

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.hpp
# Opt level: O2

void __thiscall EOClient::EOClient(EOClient *this,Socket *sock,EOServer *server_)

{
  Client::Client(&this->super_Client,sock,&server_->super_Server);
  (this->super_Client)._vptr_Client = (_func_int **)&PTR_NeedTick_001bc540;
  (this->send_buffer2)._M_dataplus._M_p = (pointer)&(this->send_buffer2).field_2;
  (this->send_buffer2)._M_string_length = 0;
  (this->send_buffer2).field_2._M_local_buf[0] = '\0';
  this->start = 0.0;
  this->next_eif_id = 1;
  this->next_enf_id = 1;
  this->next_esf_id = 1;
  this->next_ecf_id = 1;
  ActionQueue::ActionQueue(&this->queue);
  (this->data)._M_dataplus._M_p = (pointer)&(this->data).field_2;
  (this->data)._M_string_length = 0;
  (this->data).field_2._M_local_buf[0] = '\0';
  PacketProcessor::PacketProcessor(&this->processor);
  Initialize(this);
  return;
}

Assistant:

EOClient(const Socket &sock, EOServer *server_) : Client(sock, server_)
		{
			this->Initialize();
		}